

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

bool __thiscall cfd::core::ByteData160::Equals(ByteData160 *this,ByteData160 *bytedata)

{
  bool bVar1;
  ByteData160 *bytedata_local;
  ByteData160 *this_local;
  
  bVar1 = ::std::operator==(&this->data_,&bytedata->data_);
  return bVar1;
}

Assistant:

bool ByteData160::Equals(const ByteData160& bytedata) const {
  if (data_ == bytedata.data_) {
    return true;
  }
  return false;
}